

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O3

double __thiscall
HighsPseudocost::getPseudocostDown(HighsPseudocost *this,HighsInt col,double frac,double offset)

{
  int iVar1;
  double dVar2;
  double local_18;
  
  iVar1 = (this->nsamplesdown).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  if (iVar1 == 0) {
    dVar2 = 0.0;
  }
  else {
    if (this->minreliable <= iVar1) {
      local_18 = (this->pseudocostdown).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[col];
      goto LAB_002adf81;
    }
    dVar2 = ((double)iVar1 * 0.1) / (double)this->minreliable + 0.9;
  }
  local_18 = (1.0 - dVar2) * this->cost_total +
             (this->pseudocostdown).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[col] * dVar2;
LAB_002adf81:
  dVar2 = floor(frac);
  return (local_18 + offset) * (frac - dVar2);
}

Assistant:

double getPseudocostDown(HighsInt col, double frac, double offset) const {
    double down = frac - std::floor(frac);
    double cost;

    if (nsamplesdown[col] == 0 || nsamplesdown[col] < minreliable) {
      double weightPs = nsamplesdown[col] == 0
                            ? 0
                            : 0.9 + 0.1 * nsamplesdown[col] /
                                        static_cast<double>(minreliable);
      cost = weightPs * pseudocostdown[col];
      cost += (1.0 - weightPs) * getAvgPseudocost();
    } else
      cost = pseudocostdown[col];

    return down * (offset + cost);
  }